

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O1

void parse_arguments(int argc,char **argv)

{
  byte bVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  OptionParser *parser;
  int iVar4;
  char *argv_00;
  OptionResult result;
  OptionResult local_50;
  char **local_38;
  
  argv_00 = (char *)0x9;
  parser = option_parser_new(parse_arguments::options,9,argc,argv);
  bVar2 = false;
  do {
    if (bVar2) {
      if (s_rom_filename != (char *)0x0) {
        option_parser_delete(parser);
        return;
      }
      parse_arguments_cold_1();
      goto LAB_001132a5;
    }
    argv_00 = (char *)parser;
    option_parser_next(&local_50,parser);
    iVar4 = 0;
    iVar3 = 0;
    switch(local_50.kind) {
    case OPTION_RESULT_KIND_UNKNOWN:
      parse_arguments_cold_4();
      goto LAB_0011325a;
    case OPTION_RESULT_KIND_EXPECTED_VALUE:
      parse_arguments_cold_3();
      goto LAB_0011325a;
    case OPTION_RESULT_KIND_BAD_SHORT_OPTION:
      argv_00 = (char *)&local_50.field_2;
      parse_arguments_cold_2();
LAB_0011325a:
      iVar3 = 5;
      break;
    case OPTION_RESULT_KIND_OPTION:
      bVar1 = (local_50.option)->short_name;
      if (bVar1 < 0x68) {
        if (bVar1 == 0x43) {
          s_cgb_color_curve = atoi(local_50.field_2.value);
          iVar3 = iVar4;
        }
        else if (bVar1 == 0x4a) {
          s_write_joypad_filename = local_50.field_2.value;
          iVar3 = iVar4;
        }
        else {
          if (bVar1 != 0x50) goto LAB_001131d4;
          s_builtin_palette = atoi(local_50.field_2.value);
          iVar3 = iVar4;
        }
      }
      else if (bVar1 < 0x73) {
        if (bVar1 == 0x68) goto LAB_0011325a;
        if (bVar1 == 0x6a) {
          s_read_joypad_filename = local_50.field_2.value;
          iVar3 = iVar4;
        }
        else {
LAB_001131d4:
          __s1 = (local_50.option)->long_name;
          argv_00 = "force-dmg";
          local_38 = argv;
          iVar3 = strcmp(__s1,"force-dmg");
          if (iVar3 == 0) {
            s_force_dmg = TRUE;
            argv = local_38;
            iVar3 = iVar4;
          }
          else {
            argv_00 = "sgb-border";
            iVar3 = strcmp(__s1,"sgb-border");
            if (iVar3 != 0) {
              abort();
            }
            s_use_sgb_border = TRUE;
            argv = local_38;
            iVar3 = iVar4;
          }
        }
      }
      else if (bVar1 == 0x73) {
        s_random_seed = atoi(local_50.field_2.value);
        iVar3 = iVar4;
      }
      else {
        if (bVar1 != 0x78) goto LAB_001131d4;
        s_render_scale = atoi(local_50.field_2.value);
        iVar3 = iVar4;
      }
      break;
    case OPTION_RESULT_KIND_ARG:
      s_rom_filename = local_50.field_2.value;
      iVar3 = iVar4;
      break;
    case OPTION_RESULT_KIND_DONE:
      bVar2 = true;
      iVar3 = iVar4;
    }
  } while (iVar3 == 0);
  if (iVar3 != 5) {
    return;
  }
LAB_001132a5:
  usage((int)argv,(char **)argv_00);
  option_parser_delete(parser);
  exit(1);
}

Assistant:

void parse_arguments(int argc, char** argv) {
  static const Option options[] = {
    {'h', "help", 0},
    {'j', "read-joypad", 1},
    {'J', "write-joypad", 1},
    {'s', "seed", 1},
    {'P', "palette", 1},
    {'x', "scale", 1},
    {'C', "cgb-color", 1},
    {0, "force-dmg", 0},
    {0, "sgb-border", 0},
  };

  struct OptionParser* parser = option_parser_new(
      options, sizeof(options) / sizeof(options[0]), argc, argv);

  int errors = 0;
  int done = 0;
  while (!done) {
    OptionResult result = option_parser_next(parser);
    switch (result.kind) {
      case OPTION_RESULT_KIND_UNKNOWN:
        PRINT_ERROR("ERROR: Unknown option: %s.\n\n", result.arg);
        goto error;

      case OPTION_RESULT_KIND_EXPECTED_VALUE:
        PRINT_ERROR("ERROR: Option --%s requires a value.\n\n",
                    result.option->long_name);
        goto error;

      case OPTION_RESULT_KIND_BAD_SHORT_OPTION:
        PRINT_ERROR("ERROR: Short option -%c is too long: %s.\n\n",
                    result.option->short_name, result.arg);
        goto error;

      case OPTION_RESULT_KIND_OPTION:
        switch (result.option->short_name) {
          case 'h':
            goto error;

          case 'j':
            s_read_joypad_filename = result.value;
            break;

          case 'J':
            s_write_joypad_filename = result.value;
            break;

          case 's':
            s_random_seed = atoi(result.value);
            break;

          case 'P':
            s_builtin_palette = atoi(result.value);
            break;

          case 'x':
            s_render_scale = atoi(result.value);
            break;

          case 'C':
            s_cgb_color_curve = atoi(result.value);
            break;

          default:
            if (strcmp(result.option->long_name, "force-dmg") == 0) {
              s_force_dmg = TRUE;
            } else if (strcmp(result.option->long_name, "sgb-border") == 0) {
              s_use_sgb_border = TRUE;
            } else {
              abort();
            }
            break;
        }
        break;

      case OPTION_RESULT_KIND_ARG:
        s_rom_filename = result.value;
        break;

      case OPTION_RESULT_KIND_DONE:
        done = 1;
        break;
    }
  }

  if (!s_rom_filename) {
    PRINT_ERROR("ERROR: expected input .gb\n\n");
    goto error;
  }

  option_parser_delete(parser);
  return;

error:
  usage(argc, argv);
  option_parser_delete(parser);
  exit(1);
}